

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O1

void __thiscall
CoinSelection_SelectCoins_KnapsackSolver_match_utxo_with_asset_Test::TestBody
          (CoinSelection_SelectCoins_KnapsackSolver_match_utxo_with_asset_Test *this)

{
  bool bVar1;
  mapped_type *pmVar2;
  mapped_type_conflict *pmVar3;
  undefined8 uVar4;
  char *pcVar5;
  CoinSelectionOption *in_R9;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar6
  ;
  void *pvVar7;
  Amount AVar8;
  AssertHelper local_188;
  AssertionResult gtest_ar_3;
  long local_170;
  AssertionResult gtest_ar;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  AssertHelper local_148;
  AmountMap map_select_value;
  Amount local_110;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  map_searched_bnb;
  Amount fee;
  AmountMap map_target_amount;
  CoinSelectionOption option;
  
  GetElementsOption();
  cfd::CoinSelectionOption::SetFeeAsset(&option,&exp_dummy_asset_a);
  map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header;
  map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  map_target_amount._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&map_select_value,&exp_dummy_asset_a);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::operator[](&map_target_amount,(key_type *)&map_select_value);
  *pmVar2 = 0x253ff00;
  if ((_Base_ptr *)map_select_value._M_t._M_impl._0_8_ !=
      &map_select_value._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)map_select_value._M_t._M_impl._0_8_,
                    (ulong)((long)&(map_select_value._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  map_select_value._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &map_select_value._M_t._M_impl.super__Rb_tree_header._M_header;
  map_select_value._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  map_select_value._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  map_select_value._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  map_select_value._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       map_select_value._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::Amount::Amount(&fee);
  AVar8 = cfd::core::Amount::CreateBySatoshiAmount(0x5dc);
  local_110.amount_ = AVar8.amount_;
  local_110.ignore_check_ = AVar8.ignore_check_;
  map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header;
  map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    sVar6.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    uVar4 = 0;
    pvVar7 = (void *)0x0;
    if (bVar1) {
      GetElementsUtxoList();
      in_R9 = &option;
      cfd::CoinSelection::SelectCoins
                ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)&gtest_ar,&exp_selection,
                 &map_target_amount,(vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)&gtest_ar_3,
                 &exp_filter,in_R9,&local_110,&map_select_value,&fee,&map_searched_bnb,
                 (AmountMap *)0x0);
      uVar4 = local_158._M_allocated_capacity;
      sVar6 = gtest_ar.message_;
      pvVar7 = (void *)gtest_ar._0_8_;
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_158._M_allocated_capacity = 0;
      if (gtest_ar_3._0_8_ != 0) {
        operator_delete((void *)gtest_ar_3._0_8_,local_170 - gtest_ar_3._0_8_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x392,
               "Expected: ret = exp_selection.SelectCoins( map_target_amount, GetElementsUtxoList(), exp_filter, option, tx_fee, &map_select_value, &fee, &map_searched_bnb) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    if (gtest_ar._0_8_ != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
    sVar6.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    uVar4 = 0;
    pvVar7 = (void *)0x0;
  }
  gtest_ar_3._0_8_ = ((long)sVar6.ptr_ - (long)pvVar7 >> 3) * -0x7b425ed097b425ed;
  local_188.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"ret.size()","1",(unsigned_long *)&gtest_ar_3,(int *)&local_188);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_3);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x394,pcVar5);
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if (gtest_ar_3._0_8_ != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (gtest_ar_3._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_3._0_8_ + 8))();
      }
      gtest_ar_3.success_ = false;
      gtest_ar_3._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if ((long)sVar6.ptr_ - (long)pvVar7 == 0xd8) {
    gtest_ar_3._0_8_ = &DAT_02540be4;
    testing::internal::CmpHelperEQ<unsigned_long,long>
              ((internal *)&gtest_ar,"ret[0].amount","static_cast<int64_t>(39062500)",
               (unsigned_long *)((long)pvVar7 + 0x80),(long *)&gtest_ar_3);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_3);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_188,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x396,pcVar5);
      testing::internal::AssertHelper::operator=(&local_188,(Message *)&gtest_ar_3);
      testing::internal::AssertHelper::~AssertHelper(&local_188);
      if (gtest_ar_3._0_8_ != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (gtest_ar_3._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_3._0_8_ + 8))();
        }
        gtest_ar_3.success_ = false;
        gtest_ar_3._1_7_ = 0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  gtest_ar_3._0_8_ = map_select_value._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_188.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"map_select_value.size()","1",(unsigned_long *)&gtest_ar_3,
             (int *)&local_188);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_3);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x398,pcVar5);
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if (gtest_ar_3._0_8_ != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (gtest_ar_3._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_3._0_8_ + 8))();
      }
      gtest_ar_3.success_ = false;
      gtest_ar_3._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (map_select_value._M_t._M_impl.super__Rb_tree_header._M_node_count == 1) {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&gtest_ar,&exp_dummy_asset_a);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
             ::operator[](&map_select_value,(key_type *)&gtest_ar);
    local_188.data_._0_4_ = 0x2540be4;
    testing::internal::CmpHelperEQ<long,int>
              ((internal *)&gtest_ar_3,"map_select_value[exp_dummy_asset_a.GetHex()]","39062500",
               pmVar2,(int *)&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)gtest_ar._0_8_ != &local_158) {
      operator_delete((void *)gtest_ar._0_8_,local_158._M_allocated_capacity + 1);
    }
    if (gtest_ar_3.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar);
      if (gtest_ar_3.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_188,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x39a,pcVar5);
      testing::internal::AssertHelper::operator=(&local_188,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper(&local_188);
      if (gtest_ar._0_8_ != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (gtest_ar._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
        }
        gtest_ar.success_ = false;
        gtest_ar._1_7_ = 0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_3.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  gtest_ar_3._0_8_ = cfd::core::Amount::GetSatoshiValue(&fee);
  local_188.data_._0_4_ = 0x708;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"fee.GetSatoshiValue()","1800",(long *)&gtest_ar_3,
             (int *)&local_188);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_3);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x39c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if (gtest_ar_3._0_8_ != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (gtest_ar_3._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_3._0_8_ + 8))();
      }
      gtest_ar_3.success_ = false;
      gtest_ar_3._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  gtest_ar_3._0_8_ = map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_188.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"map_searched_bnb.size()","1",(unsigned_long *)&gtest_ar_3,
             (int *)&local_188);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_3);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x39d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if (gtest_ar_3._0_8_ != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (gtest_ar_3._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_3._0_8_ + 8))();
      }
      gtest_ar_3.success_ = false;
      gtest_ar_3._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_node_count == 1) {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&gtest_ar,&exp_dummy_asset_a);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[](&map_searched_bnb,(key_type *)&gtest_ar);
    gtest_ar_3._0_8_ = CONCAT71(gtest_ar_3._1_7_,*pmVar3) ^ 1;
    gtest_ar_3.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)gtest_ar._0_8_ != &local_158) {
      operator_delete((void *)gtest_ar._0_8_,local_158._M_allocated_capacity + 1);
    }
    if (gtest_ar_3.success_ == false) {
      testing::Message::Message((Message *)&local_188);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_3,
                 (AssertionResult *)"map_searched_bnb[exp_dummy_asset_a.GetHex()]","true","false",
                 &in_R9->use_bnb_);
      testing::internal::AssertHelper::AssertHelper
                (&local_148,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x39f,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_188);
      testing::internal::AssertHelper::~AssertHelper(&local_148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)gtest_ar._0_8_ != &local_158) {
        operator_delete((void *)gtest_ar._0_8_,local_158._M_allocated_capacity + 1);
      }
      if (local_188.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_188.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_188.data_ + 8))();
        }
        local_188.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_3.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if (pvVar7 != (void *)0x0) {
    operator_delete(pvVar7,uVar4 - (long)pvVar7);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~_Rb_tree(&map_searched_bnb._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~_Rb_tree(&map_select_value._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~_Rb_tree(&map_target_amount._M_t);
  option.fee_asset_._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_0087ccc8;
  if (option.fee_asset_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(option.fee_asset_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)option.fee_asset_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)option.fee_asset_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_KnapsackSolver_match_utxo_with_asset)
{
  CoinSelectionOption option = GetElementsOption();
  option.SetFeeAsset(exp_dummy_asset_a);
  // 39062500 - 1800 - 1500
  AmountMap map_target_amount;
  map_target_amount[exp_dummy_asset_a.GetHex()] = 39059200;
  AmountMap map_select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  std::map<std::string, bool> map_searched_bnb;
  std::vector<Utxo> ret;
  EXPECT_NO_THROW(ret = exp_selection.SelectCoins(
      map_target_amount, GetElementsUtxoList(), exp_filter, option,
      tx_fee, &map_select_value, &fee, &map_searched_bnb));

  EXPECT_EQ(ret.size(), 1);
  if (ret.size() == 1) {
    EXPECT_EQ(ret[0].amount, static_cast<int64_t>(39062500));
  }
  EXPECT_EQ(map_select_value.size(), 1);
  if (map_select_value.size() == 1) {
    EXPECT_EQ(map_select_value[exp_dummy_asset_a.GetHex()], 39062500);
  }
  EXPECT_EQ(fee.GetSatoshiValue(), 1800);
  EXPECT_EQ(map_searched_bnb.size(), 1);
  if (map_searched_bnb.size() == 1) {
    EXPECT_FALSE(map_searched_bnb[exp_dummy_asset_a.GetHex()]);
  }
}